

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O1

void __thiscall Diligent::DeviceObjectArchive::Clear(DeviceObjectArchive *this)

{
  IDataBlob *pIVar1;
  long lVar2;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> avStack_c0 [7];
  
  std::
  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)this);
  lVar2 = 0;
  do {
    *(undefined8 *)
     ((long)&avStack_c0[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&avStack_c0[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&avStack_c0[0].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xa8);
  lVar2 = 0;
  do {
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::_M_move_assign
              ((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
               ((long)&(this->m_DeviceShaders)._M_elems[0].
                       super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2),
               (long)&avStack_c0[0].
                      super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xa8);
  lVar2 = 0x90;
  do {
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::~vector
              ((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
               ((long)&avStack_c0[0].
                       super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  pIVar1 = (this->m_pArchiveData).m_pObject;
  if (pIVar1 != (IDataBlob *)0x0) {
    (*(pIVar1->super_IObject)._vptr_IObject[2])();
    (this->m_pArchiveData).m_pObject = (IDataBlob *)0x0;
  }
  this->m_ContentVersion = 0;
  return;
}

Assistant:

void DeviceObjectArchive::Clear() noexcept
{
    m_NamedResources.clear();
    m_DeviceShaders = {};
    m_pArchiveData.Release();
    m_ContentVersion = 0;
}